

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void copytypeinfo(rnntypeinfo *dst,rnntypeinfo *src,char *file)

{
  int iVar1;
  char *pcVar2;
  rnnvalue **pprVar3;
  rnnvalue *prVar4;
  rnnbitfield **pprVar5;
  rnnbitfield *prVar6;
  int local_24;
  int i;
  char *file_local;
  rnntypeinfo *src_local;
  rnntypeinfo *dst_local;
  
  dst->name = src->name;
  if (dst->name != (char *)0x0) {
    pcVar2 = strdup(dst->name);
    dst->name = pcVar2;
  }
  dst->shr = src->shr;
  dst->add = src->add;
  dst->min = src->min;
  dst->max = src->max;
  dst->align = src->align;
  for (local_24 = 0; local_24 < src->valsnum; local_24 = local_24 + 1) {
    if (dst->valsmax <= dst->valsnum) {
      if (dst->valsmax == 0) {
        dst->valsmax = 0x10;
      }
      else {
        dst->valsmax = dst->valsmax << 1;
      }
      pprVar3 = (rnnvalue **)realloc(dst->vals,(long)dst->valsmax << 3);
      dst->vals = pprVar3;
    }
    prVar4 = copyvalue(src->vals[local_24],file);
    iVar1 = dst->valsnum;
    dst->valsnum = iVar1 + 1;
    dst->vals[iVar1] = prVar4;
  }
  for (local_24 = 0; local_24 < src->bitfieldsnum; local_24 = local_24 + 1) {
    if (dst->bitfieldsmax <= dst->bitfieldsnum) {
      if (dst->bitfieldsmax == 0) {
        dst->bitfieldsmax = 0x10;
      }
      else {
        dst->bitfieldsmax = dst->bitfieldsmax << 1;
      }
      pprVar5 = (rnnbitfield **)realloc(dst->bitfields,(long)dst->bitfieldsmax << 3);
      dst->bitfields = pprVar5;
    }
    prVar6 = copybitfield(src->bitfields[local_24],file);
    iVar1 = dst->bitfieldsnum;
    dst->bitfieldsnum = iVar1 + 1;
    dst->bitfields[iVar1] = prVar6;
  }
  return;
}

Assistant:

static void copytypeinfo (struct rnntypeinfo *dst, struct rnntypeinfo *src, char *file) {
	int i;
	dst->name = src->name;
	if (dst->name)
		dst->name = strdup(dst->name);
	dst->shr = src->shr;
	dst->add = src->add;
	dst->min = src->min;
	dst->max = src->max;
	dst->align = src->align;
	for (i = 0; i < src->valsnum; i++)
		ADDARRAY(dst->vals, copyvalue(src->vals[i], file));
	for (i = 0; i < src->bitfieldsnum; i++)
		ADDARRAY(dst->bitfields, copybitfield(src->bitfields[i], file));
}